

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O2

void P_DisconnectEffect(AActor *actor)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  particle_t *ppVar6;
  int *piVar7;
  int iVar8;
  DVector3 pos;
  
  if (actor != (AActor *)0x0) {
    iVar8 = -0x40;
    while ((iVar8 != 0 && (ppVar6 = JitterParticle(0x46), ppVar6 != (particle_t *)0x0))) {
      iVar3 = FRandom::operator()(&M_Random);
      dVar1 = actor->radius;
      iVar4 = FRandom::operator()(&M_Random);
      dVar2 = actor->radius;
      iVar5 = FRandom::operator()(&M_Random);
      AActor::Vec3Offset(&pos,actor,(double)(iVar3 + -0x80) * dVar1 * 0.0078125,
                         (double)(iVar4 + -0x80) * dVar2 * 0.0078125,
                         (double)iVar5 * actor->Height * 0.00390625,false);
      (ppVar6->Pos).Z = pos.Z;
      (ppVar6->Pos).X = pos.X;
      (ppVar6->Pos).Y = pos.Y;
      (ppVar6->Acc).Z = (ppVar6->Acc).Z + -0.000244140625;
      iVar3 = FRandom::operator()(&M_Random);
      piVar7 = &maroon2;
      if (iVar3 < 0x80) {
        piVar7 = &maroon1;
      }
      ppVar6->color = *piVar7;
      ppVar6->size = 4.0;
      iVar8 = iVar8 + 1;
    }
  }
  return;
}

Assistant:

void P_DisconnectEffect (AActor *actor)
{
	int i;

	if (actor == NULL)
		return;

	for (i = 64; i; i--)
	{
		particle_t *p = JitterParticle (TICRATE*2);

		if (!p)
			break;

		double xo = (M_Random() - 128)*actor->radius / 128;
		double yo = (M_Random() - 128)*actor->radius / 128;
		double zo = M_Random()*actor->Height / 256;

		DVector3 pos = actor->Vec3Offset(xo, yo, zo);
		p->Pos = pos;
		p->Acc.Z -= 1./4096;
		p->color = M_Random() < 128 ? maroon1 : maroon2;
		p->size = 4;
	}
}